

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O0

bool phyr::solveQuadraticSystem(FPError a,FPError b,FPError c,FPError *t1,FPError *t2)

{
  FPError *in_RSI;
  FPError *in_RDI;
  double dVar1;
  double dVar2;
  FPError den;
  FPError det;
  FPError *this;
  undefined1 *_v;
  FPError *this_00;
  FPError *in_stack_fffffffffffffe68;
  FPError *in_stack_fffffffffffffe70;
  FPError *in_stack_fffffffffffffe98;
  FPError *in_stack_fffffffffffffea0;
  double local_158;
  double local_120;
  double local_118;
  double local_110;
  double local_d8;
  double local_d0;
  double local_c8;
  FPError local_60;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  FPError *local_18;
  FPError *local_10;
  bool local_1;
  
  _v = &stack0x00000038;
  this = (FPError *)&stack0x00000020;
  this_00 = (FPError *)&stack0x00000008;
  local_18 = in_RSI;
  local_10 = in_RDI;
  FPError::FPError(this_00,(double)_v,(double)this);
  local_10->v = local_30;
  local_10->lBound = local_28;
  local_10->uBound = local_20;
  FPError::FPError(this_00,(double)_v,(double)this);
  local_18->v = local_48;
  local_18->lBound = local_40;
  local_18->uBound = local_38;
  FPError::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  operator*((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  FPError::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  FPError::operator-(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  operator*((double)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  dVar1 = FPError::operator_cast_to_double(&local_60);
  if (0.0 <= dVar1) {
    dVar1 = FPError::operator_cast_to_double(&local_60);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar1 = FPError::operator_cast_to_double(&local_60);
      sqrt(dVar1);
      FPError::FPError(this_00,(double)_v,(double)this);
      FPError::operator-(this);
      FPError::operator-(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      FPError::operator/(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_10->v = local_120;
      local_10->lBound = local_118;
      local_10->uBound = local_110;
      FPError::operator-(this);
      FPError::operator+(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      FPError::operator/(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_18->v = (double)in_stack_fffffffffffffe98;
      local_18->lBound = (double)in_stack_fffffffffffffea0;
      local_18->uBound = local_158;
    }
    else {
      FPError::operator-(this);
      FPError::operator/(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_10->v = local_d8;
      local_10->lBound = local_d0;
      local_10->uBound = local_c8;
    }
    dVar1 = FPError::operator_cast_to_double(local_10);
    dVar2 = FPError::operator_cast_to_double(local_18);
    if (dVar2 < dVar1) {
      std::swap<phyr::FPError>(local_10,local_18);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool solveQuadraticSystem(FPError a, FPError b, FPError c, FPError* t1, FPError* t2) {
    // Default improbable solutions
    *t1 = MinReal; *t2 = MaxReal;

    FPError det = b*b - 4*a*c, den = 2 * a;
    // No real solutions exist
    if (Real(det) < 0) return false;
    // Single solution
    else if (Real(det) == 0) { *t1 = -b / den; }
    // Two solutions
    else {
        det = std::sqrt(Real(det));
        *t1 = (-b - det) / den; *t2 = (-b + det) / den;
    }

    if (Real(*t1) > Real(*t2)) std::swap(*t1, *t2);
    return true;
}